

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

void Gia_ManSetMark0Dfs_rec(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  if (-1 < iObj) {
    uVar5 = (ulong)(uint)iObj;
    do {
      iVar3 = (int)uVar5;
      if (p->nObjs <= iVar3) break;
      uVar2 = *(ulong *)(p->pObjs + uVar5);
      uVar4 = (uint)uVar2;
      if ((uVar4 >> 0x1e & 1) != 0) {
        return;
      }
      pGVar1 = p->pObjs + uVar5;
      *(ulong *)pGVar1 = uVar2 | 0x40000000;
      if ((int)uVar4 < 0) {
        return;
      }
      if ((uVar4 & 0x1fffffff) == 0x1fffffff) {
        return;
      }
      Gia_ManSetMark0Dfs_rec(p,iVar3 - (uVar4 & 0x1fffffff));
      uVar4 = iVar3 - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff);
      uVar5 = (ulong)uVar4;
    } while (-1 < (int)uVar4);
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManSetMark0Dfs_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    pObj = Gia_ManObj( p, iObj );
    if ( pObj->fMark0 )
        return;
    pObj->fMark0 = 1;
    if ( !Gia_ObjIsAnd(pObj) )
        return;
    Gia_ManSetMark0Dfs_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Gia_ManSetMark0Dfs_rec( p, Gia_ObjFaninId1(pObj, iObj) );
}